

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
               (tuple<testing::Matcher<StrictMockProblemBuilder_&>,_testing::Matcher<mp::SolutionHandler_&>_>
                *matchers,tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&> *values,
               ostream *os)

{
  bool bVar1;
  StringMatchResultListener *this;
  ostream *in_RDX;
  tuple<testing::Matcher<StrictMockProblemBuilder_&>,_testing::Matcher<mp::SolutionHandler_&>_>
  *in_RSI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  Matcher<mp::SolutionHandler_&> *in_stack_fffffffffffffde8;
  StringMatchResultListener *in_stack_fffffffffffffdf0;
  string local_200 [16];
  StringMatchResultListener *in_stack_fffffffffffffe10;
  ostream *in_stack_ffffffffffffffe0;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>,std::tuple<StrictMockProblemBuilder&,mp::SolutionHandler&>>
            (in_RSI,(tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&> *)in_RDX,
             in_stack_ffffffffffffffe0);
  std::get<1ul,testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>
            ((tuple<testing::Matcher<StrictMockProblemBuilder_&>,_testing::Matcher<mp::SolutionHandler_&>_>
              *)0x169e59);
  Matcher<mp::SolutionHandler_&>::Matcher
            ((Matcher<mp::SolutionHandler_&> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  std::get<1ul,StrictMockProblemBuilder&,mp::SolutionHandler&>
            ((tuple<StrictMockProblemBuilder_&,_mp::SolutionHandler_&> *)0x169e76);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe10);
  bVar1 = MatcherBase<mp::SolutionHandler_&>::MatchAndExplain
                    ((MatcherBase<mp::SolutionHandler_&> *)in_stack_fffffffffffffdf0,
                     (SolutionHandler *)in_stack_fffffffffffffde8,(MatchResultListener *)0x169ea4);
  if (!bVar1) {
    in_stack_fffffffffffffdf0 =
         (StringMatchResultListener *)std::operator<<(in_RDX,"  Expected arg #");
    this = (StringMatchResultListener *)std::ostream::operator<<(in_stack_fffffffffffffdf0,1);
    std::operator<<((ostream *)this,": ");
    std::get<1ul,testing::Matcher<StrictMockProblemBuilder&>,testing::Matcher<mp::SolutionHandler&>>
              ((tuple<testing::Matcher<StrictMockProblemBuilder_&>,_testing::Matcher<mp::SolutionHandler_&>_>
                *)0x169f07);
    MatcherBase<mp::SolutionHandler_&>::DescribeTo
              ((MatcherBase<mp::SolutionHandler_&> *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::operator<<(in_RDX,"\n           Actual: ");
    UniversalPrint<mp::SolutionHandler>
              ((SolutionHandler *)in_stack_fffffffffffffdf0,(ostream *)this);
    StringMatchResultListener::str_abi_cxx11_(this);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffdf0,(ostream *)this);
    std::__cxx11::string::~string(local_200);
    std::operator<<(in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdf0);
  Matcher<mp::SolutionHandler_&>::~Matcher((Matcher<mp::SolutionHandler_&> *)0x169fde);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }